

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

wstring * __thiscall
jessilib::encode_codepoint_w_abi_cxx11_
          (wstring *__return_storage_ptr__,jessilib *this,char32_t in_codepoint)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if ((uint)(wchar_t)this < 0x110000) {
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
    push_back(__return_storage_ptr__,(wchar_t)this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring encode_codepoint_w(char32_t in_codepoint) {
	std::wstring result;
	encode_codepoint(result, in_codepoint);
	return result;
}